

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O1

int rhash_file_update(rhash ctx,FILE *fd)

{
  int iVar1;
  void *__ptr;
  size_t length;
  int *piVar2;
  int iVar3;
  
  iVar1 = 0;
  if (ctx[1].hash_id == 0xb01dbabe) {
    if (ctx == (rhash)0x0) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
    }
    else {
      __ptr = (void *)aligned_alloc(0x40,0x2000);
      if (__ptr != (void *)0x0) {
        iVar1 = feof((FILE *)fd);
        while( true ) {
          iVar3 = 0;
          if ((iVar1 != 0) || (iVar3 = 0, ctx[1].hash_id != 0xb01dbabe)) goto LAB_007e9d16;
          length = fread(__ptr,1,0x2000,(FILE *)fd);
          iVar1 = ferror((FILE *)fd);
          if (iVar1 != 0) break;
          if (length != 0) {
            rhash_update(ctx,__ptr,length);
            if ((code *)ctx[2].msg_size != (code *)0x0) {
              (*(code *)ctx[2].msg_size)(*(undefined8 *)&ctx[2].hash_id,ctx->msg_size);
            }
          }
          iVar1 = feof((FILE *)fd);
        }
        iVar3 = -1;
LAB_007e9d16:
        free(__ptr);
        return iVar3;
      }
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

RHASH_API int rhash_file_update(rhash ctx, FILE* fd)
{
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	const size_t block_size = 8192;
	unsigned char* buffer;
	size_t length = 0;
	int res = 0;
	if (ectx->state != STATE_ACTIVE)
		return 0; /* do nothing if canceled */
	if (ctx == NULL) {
		errno = EINVAL;
		return -1;
	}
	buffer = (unsigned char*)rhash_aligned_alloc(DEFAULT_ALIGNMENT, block_size);
	if (!buffer)
		return -1; /* errno is set to ENOMEM according to UNIX 98 */

	while (!feof(fd)) {
		if (ectx->state != STATE_ACTIVE)
			break; /* stop if canceled */
		length = fread(buffer, 1, block_size, fd);

		if (ferror(fd)) {
			res = -1; /* note: errno contains error code */
			break;
		} else if (length) {
			rhash_update(ctx, buffer, length);

			if (ectx->callback) {
				((rhash_callback_t)ectx->callback)(ectx->callback_data, ectx->rc.msg_size);
			}
		}
	}
	rhash_aligned_free(buffer);
	return res;
}